

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

void BinaryenTrySetCatchBodyAt
               (BinaryenExpressionRef expr,BinaryenIndex index,BinaryenExpressionRef catchExpr)

{
  if (expr->_id != TryId) {
    __assert_fail("expression->is<Try>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0xebd,
                  "void BinaryenTrySetCatchBodyAt(BinaryenExpressionRef, BinaryenIndex, BinaryenExpressionRef)"
                 );
  }
  if ((ulong)index < *(ulong *)(expr + 5)) {
    if (catchExpr != (BinaryenExpressionRef)0x0) {
      *(BinaryenExpressionRef *)(expr[4].type.id + (ulong)index * 8) = catchExpr;
      return;
    }
    __assert_fail("catchExpr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0xebf,
                  "void BinaryenTrySetCatchBodyAt(BinaryenExpressionRef, BinaryenIndex, BinaryenExpressionRef)"
                 );
  }
  __assert_fail("index < static_cast<Try*>(expression)->catchBodies.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0xebe,
                "void BinaryenTrySetCatchBodyAt(BinaryenExpressionRef, BinaryenIndex, BinaryenExpressionRef)"
               );
}

Assistant:

void BinaryenTrySetCatchBodyAt(BinaryenExpressionRef expr,
                               BinaryenIndex index,
                               BinaryenExpressionRef catchExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Try>());
  assert(index < static_cast<Try*>(expression)->catchBodies.size());
  assert(catchExpr);
  static_cast<Try*>(expression)->catchBodies[index] = (Expression*)catchExpr;
}